

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeSection
          (SonarQubeReporter *this,string *rootName,SectionNode *sectionNode,bool okToFail)

{
  StringRef attribute;
  byte bVar1;
  undefined1 okToFail_00;
  bool bVar2;
  ulong uVar3;
  reference this_00;
  byte in_CL;
  string *in_RDX;
  SonarQubeReporter *in_RSI;
  SectionNode *in_RDI;
  StringRef SVar4;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *__range1;
  ScopedElement e;
  string name;
  SectionNode *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  SectionNode *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  XmlFormatting fmt;
  undefined7 in_stack_fffffffffffffed0;
  SonarQubeReporter *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  StringRef in_stack_ffffffffffffff08;
  StringRef in_stack_ffffffffffffff38;
  string local_80 [32];
  string local_60 [32];
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  trim(in_stack_fffffffffffffec8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffec8,(char)((ulong)in_stack_fffffffffffffec0 >> 0x38));
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  okToFail_00 = CumulativeReporterBase::SectionNode::hasAnyAssertions(in_stack_fffffffffffffec0);
  if ((((bool)okToFail_00) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) ||
     (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    fmt = (XmlFormatting)((ulong)&stack0xffffffffffffff3f >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0._M_current,in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)in_RDI,(string *)CONCAT17(okToFail_00,in_stack_fffffffffffffed0),fmt);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
    SVar4 = operator____sr((char *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8)
    ;
    attribute.m_size = in_stack_ffffffffffffff00;
    attribute.m_start = in_stack_fffffffffffffef8;
    XmlWriter::writeAttribute
              ((XmlWriter *)in_stack_fffffffffffffef0._M_current,in_stack_ffffffffffffff08,attribute
              );
    in_stack_fffffffffffffeb0 = &in_RDI->stdErr;
    operator____sr((char *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
    XmlWriter::writeAttribute<long,void>
              ((XmlWriter *)SVar4.m_size,in_stack_ffffffffffffff38,(long *)SVar4.m_start);
    writeAssertions(in_stack_fffffffffffffee0,in_RDI,(bool)okToFail_00);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffeb0);
  }
  std::
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::begin((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           *)in_stack_fffffffffffffea8);
  std::
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::end((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         *)in_stack_fffffffffffffea8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffea8), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ::operator*((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                           *)&stack0xfffffffffffffef0);
    in_stack_fffffffffffffea8 =
         Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    writeSection(in_RSI,in_RDX,(SectionNode *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 (bool)in_stack_ffffffffffffffdf);
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                  *)&stack0xfffffffffffffef0);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void SonarQubeReporter::writeSection(std::string const& rootName, SectionNode const& sectionNode, bool okToFail) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if ( sectionNode.hasAnyAssertions()
            || !sectionNode.stdOut.empty()
            ||  !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement("testCase");
            xml.writeAttribute("name"_sr, name);
            xml.writeAttribute("duration"_sr, static_cast<long>(sectionNode.stats.durationInSeconds * 1000));

            writeAssertions(sectionNode, okToFail);
        }

        for (auto const& childNode : sectionNode.childSections)
            writeSection(name, *childNode, okToFail);
    }